

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendCloseDueToError
          (WebSocketImpl *this,uint16_t code,StringPtr reason)

{
  bool bVar1;
  long lVar2;
  SourceLocation location;
  SourceLocation location_00;
  WebSocket WVar3;
  void *pvVar4;
  undefined6 in_register_00000032;
  WebSocketImpl *this_00;
  char *in_R8;
  char *pcVar5;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3620:29)>
  *location_01;
  StringPtr reason_00;
  Array<unsigned_char> payload;
  OwnPromiseNode intermediate;
  PromiseFulfiller<void> *in_stack_ffffffffffffff30;
  Disposer *in_stack_ffffffffffffff38;
  PromiseFulfiller<void> *in_stack_ffffffffffffff40;
  PromiseFulfillerPair<void> paf;
  void *continuationTracePtr;
  size_t local_98;
  ArrayDisposer *pAStack_90;
  WebSocket local_88;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  ControlMessage local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  this_00 = (WebSocketImpl *)CONCAT62(in_register_00000032,code);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_78 = "sendCloseDueToError";
  local_70 = 0x1000000e21;
  location_00.function = (char *)in_stack_ffffffffffffff38;
  location_00.fileName = (char *)in_stack_ffffffffffffff30;
  location_00._16_8_ = in_stack_ffffffffffffff40;
  pcVar5 = in_R8;
  newPromiseAndFulfiller<void>(location_00);
  paf.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
  bVar1 = (this_00->queuedControlMessage).ptr.isSet;
  reason_00.content.size_ = (size_t)pcVar5;
  reason_00.content.ptr = in_R8;
  serializeClose(&payload,(WebSocketImpl *)(ulong)(uint)reason.content.ptr,
                 (uint16_t)reason.content.size_,reason_00);
  continuationTracePtr = payload.ptr;
  local_98 = payload.size_;
  pAStack_90 = payload.disposer;
  payload.ptr = (uchar *)0x0;
  payload.size_ = 0;
  ControlMessage::ControlMessage
            (&local_68,'\b',(Array<unsigned_char> *)&continuationTracePtr,
             (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)&intermediate);
  Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
            (&this_00->queuedControlMessage,&local_68);
  ControlMessage::~ControlMessage(&local_68);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&intermediate);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&continuationTracePtr);
  if (bVar1 == false) {
    setUpSendingControlMessage(this_00);
  }
  Array<unsigned_char>::~Array(&payload);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&stack0xffffffffffffff38);
  local_68.payload.ptr._0_2_ = reason.content.ptr._0_2_;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3620:29)>
       ::anon_class_32_3_b9a24fbc_for_func::operator();
  lVar2 = *(long *)((long)paf.promise.super_PromiseBase.node.ptr + 8);
  local_68._0_8_ = this_00;
  local_68.payload.size_ = reason.content.size_;
  if (lVar2 == 0 || (ulong)((long)paf.promise.super_PromiseBase.node.ptr - lVar2) < 0x40) {
    pvVar4 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3620:29)>
                   *)((long)pvVar4 + 0x3c0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::sendCloseDueToError(unsigned_short,kj::StringPtr)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::sendCloseDueToError(unsigned_short,kj::StringPtr)::_lambda()_1_,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,
               (anon_class_32_3_b9a24fbc_for_func *)&local_68,&continuationTracePtr);
    *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
  }
  else {
    *(undefined8 *)((long)paf.promise.super_PromiseBase.node.ptr + 8) = 0;
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3620:29)>
                   *)((long)paf.promise.super_PromiseBase.node.ptr + -0x40);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::sendCloseDueToError(unsigned_short,kj::StringPtr)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::sendCloseDueToError(unsigned_short,kj::StringPtr)::_lambda()_1_,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,
               (anon_class_32_3_b9a24fbc_for_func *)&local_68,&continuationTracePtr);
    *(long *)((long)paf.promise.super_PromiseBase.node.ptr + -0x38) = lVar2;
  }
  payload.ptr = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h";
  payload.size_ = (size_t)&DAT_0042a1d1;
  payload.disposer = (ArrayDisposer *)0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_01;
  kj::_::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
            ((OwnPromiseNode *)&local_88,
             (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             &intermediate,location);
  WVar3._vptr_WebSocket = local_88._vptr_WebSocket;
  local_88._vptr_WebSocket = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88);
  (this->super_WebSocket)._vptr_WebSocket = WVar3._vptr_WebSocket;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> sendCloseDueToError(uint16_t code, kj::StringPtr reason){
    auto paf = newPromiseAndFulfiller<void>();
    queueClose(code, reason, kj::mv(paf.fulfiller));

    return paf.promise.then([this, code, reason]() -> kj::Promise<Message> {
        return errorHandler.handleWebSocketProtocolError({
            code, reason
          });
      });
  }